

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
::insert(Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  RawBrandedSchema *pRVar2;
  unsigned_long *puVar3;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                       *)this,(*(long *)(this + 8) - *(long *)this >> 3) * -0x3333333333333333,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    puVar3 = *(unsigned_long **)(this + 8);
    if (puVar3 == *(unsigned_long **)(this + 0x10)) {
      newSize = 4;
      if (puVar3 != *(unsigned_long **)this) {
        newSize = ((long)puVar3 - (long)*(unsigned_long **)this >> 3) * -0x6666666666666666;
      }
      Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
      setCapacity((Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                   *)this,newSize);
      puVar3 = *(unsigned_long **)(this + 8);
    }
    pRVar2 = (row->value).super_Schema.raw;
    *puVar3 = row->key;
    puVar3[1] = (unsigned_long)pRVar2;
    pRVar2 = row[1].value.super_Schema.raw;
    puVar3[2] = row[1].key;
    puVar3[3] = (unsigned_long)pRVar2;
    puVar3[4] = row[2].key;
    (row->value).super_Schema.raw = (RawBrandedSchema *)0x0;
    row[1].key = 0;
    row[1].value.super_Schema.raw = (RawBrandedSchema *)0x0;
    pEVar1 = *(Entry **)(this + 8);
    *(InterfaceSchema **)(this + 8) = &pEVar1[2].value;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}